

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptNativeFloatArray *
Js::JavascriptArray::DeepCopyInstance<Js::JavascriptNativeFloatArray>
          (JavascriptNativeFloatArray *instance)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DynamicTypeHandler *this;
  type_info *ptVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  JavascriptNativeFloatArray *this_00;
  type_info *size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this = DynamicObject::GetTypeHandler((DynamicObject *)instance);
  ptVar4 = (type_info *)DynamicTypeHandler::GetInlineSlotsSize(this);
  bVar2 = IsInlineSegment((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr,
                          (JavascriptArray *)instance);
  if (bVar2) {
    ptVar4 = ptVar4 + (ulong)((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr
                             )->size * 8 + 0x18;
  }
  pRVar5 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
  local_50 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6adf93b;
  data.filename._0_4_ = 0x2f4f;
  data.typeinfo = ptVar4;
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,(TrackAllocData *)local_50);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00bad166;
    *puVar6 = 0;
  }
  size = (type_info *)&DAT_ffffffffffffffff;
  if (ptVar4 < (type_info *)0xffffffffffffffc0) {
    size = ptVar4 + 0x40;
  }
  this_00 = (JavascriptNativeFloatArray *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (pRVar5,(size_t)size);
  if (this_00 == (JavascriptNativeFloatArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00bad166:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  JavascriptNativeFloatArray::JavascriptNativeFloatArray(this_00,instance,true,true);
  return this_00;
}

Assistant:

T * JavascriptArray::DeepCopyInstance(T * instance)
    {
        size_t allocSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (IsInlineSegment(instance->head, instance))
        {
            allocSize += sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement);
        }

        return RecyclerNewPlusZ(instance->GetRecycler(), allocSize, T, instance, true /*boxHead*/, true /*deepCopy*/);
    }